

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O1

void __thiscall
ExchangeCompilation_TwoDefinitions_Test::~ExchangeCompilation_TwoDefinitions_Test
          (ExchangeCompilation_TwoDefinitions_Test *this)

{
  (this->super_ExchangeCompilation).super_Test._vptr_Test =
       (_func_int **)&PTR__ExchangeCompilation_0023bd38;
  pstore::database::~database(&(this->super_ExchangeCompilation).import_db_);
  in_memory_store::~in_memory_store(&(this->super_ExchangeCompilation).import_store_);
  pstore::database::~database(&(this->super_ExchangeCompilation).export_db_);
  in_memory_store::~in_memory_store(&(this->super_ExchangeCompilation).export_store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x290);
  return;
}

Assistant:

TEST_F (ExchangeCompilation, TwoDefinitions) {
    using namespace pstore::exchange;
    constexpr auto comments = false;

    // Add names to the store so that external fixups can use then. add_export_strings()
    // yields a mapping from each name to its indirect-address.
    constexpr auto * name1 = "name1";
    constexpr auto * name2 = "name2";
    constexpr auto * triple = "triple";
    constexpr auto name_index = pstore::trailer::indices::name;

    std::array<pstore::gsl::czstring, 3> names{{triple, name1, name2}};
    std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>> indir_strings;
    add_export_strings<name_index> (export_db_, std::begin (names), std::end (names),
                                    std::inserter (indir_strings, std::end (indir_strings)));

    // Write the names that we just created as JSON.
    export_ns::string_mapping exported_names{export_db_, export_ns::name_index_tag ()};
    export_ns::ostringstream exported_names_stream;
    export_ns::emit_strings<name_index> (exported_names_stream, export_ns::indent{}, export_db_,
                                         export_db_.get_current_revision (), "", &exported_names,
                                         comments);

    // Now build a single fragment and a compilation that references it then export them.
    constexpr pstore::index::digest compilation_digest{0x12345678, 0x9ABCDEF0};
    constexpr pstore::index::digest fragment_digest{0x9ABCDEF0, 0x12345678};

    export_ns::ostringstream exported_compilation_stream;
    export_ns::ostringstream exported_fragment_stream;

    {
        mock_mutex mutex;
        auto transaction = begin (export_db_, transaction_lock{mutex});
        pstore::extent<pstore::repo::fragment> const fext =
            build_fragment (transaction, fragment_digest);
        emit_fragment (exported_fragment_stream, export_ns::indent{}, export_db_, exported_names,
                       export_db_.getro (fext), comments);

        std::vector<pstore::repo::definition> definitions{
            {fragment_digest, fext, indir_strings[name1], pstore::repo::linkage::external,
             pstore::repo::visibility::hidden_vis},
            {fragment_digest, fext, indir_strings[name2], pstore::repo::linkage::link_once_any,
             pstore::repo::visibility::default_vis},
        };
        pstore::extent<pstore::repo::compilation> const compilation =
            pstore::repo::compilation::alloc (transaction, indir_strings[triple],
                                              std::begin (definitions), std::end (definitions));

        emit_compilation (exported_compilation_stream, export_ns::indent{}, export_db_,
                          *export_db_.getro (compilation), exported_names, comments);
        transaction.commit ();
    }


    // Now begin to export the three pieces: the names, the fragment, and finally the compilation.
    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});


    import_ns::string_mapping imported_names;
    {
        auto name_parser = import_strings_parser (&transaction, &imported_names);
        name_parser.input (exported_names_stream.str ()).eof ();
        ASSERT_FALSE (name_parser.has_error ())
            << "JSON error was: " << name_parser.last_error ().message () << ' '
            << name_parser.coordinate () << '\n'
            << exported_names_stream.str ();
    }
    {
        auto fragment_parser =
            import_fragment_parser (&transaction, &imported_names, &fragment_digest);
        fragment_parser.input (exported_fragment_stream.str ()).eof ();
        ASSERT_FALSE (fragment_parser.has_error ())
            << "JSON error was: " << fragment_parser.last_error ().message () << ' '
            << fragment_parser.coordinate () << '\n'
            << exported_fragment_stream.str ();
    }
    {
        auto const fragment_index =
            pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
        auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                             fragment_index, compilation_digest);
        compilation_parser.input (exported_compilation_stream.str ()).eof ();
        ASSERT_FALSE (compilation_parser.has_error ())
            << "JSON error was: " << compilation_parser.last_error ().message () << ' '
            << compilation_parser.coordinate () << '\n'
            << exported_compilation_stream.str ();
    }

    // Everything is now imported. Let's check what the resulting compilation record looks like.
    auto const compilation_index =
        pstore::index::get_index<pstore::trailer::indices::compilation> (import_db_);
    auto const pos = compilation_index->find (import_db_, compilation_digest);
    ASSERT_NE (pos, compilation_index->end (import_db_))
        << "Compilation was not found in the index after import";

    auto const compilation = import_db_.getro (pos->second);
    EXPECT_EQ (load_string (import_db_, compilation->triple ()), triple);
    ASSERT_EQ (compilation->size (), 2U);
    {
        pstore::repo::definition const & def1 = (*compilation)[0];
        EXPECT_EQ (def1.digest, fragment_digest);
        EXPECT_EQ (load_string (import_db_, def1.name), name1);
        EXPECT_EQ (def1.linkage (), pstore::repo::linkage::external);
        EXPECT_EQ (def1.visibility (), pstore::repo::visibility::hidden_vis);
    }
    {
        pstore::repo::definition const & def2 = (*compilation)[1];
        EXPECT_EQ (def2.digest, fragment_digest);
        EXPECT_EQ (load_string (import_db_, def2.name), name2);
        EXPECT_EQ (def2.linkage (), pstore::repo::linkage::link_once_any);
        EXPECT_EQ (def2.visibility (), pstore::repo::visibility::default_vis);
    }

    transaction.commit ();
}